

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Extractor::extract(Extractor *this,int blob_index,Mat *feat)

{
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  int in_ESI;
  long *in_RDI;
  Mat bottom_blob_unpacked;
  int layer_index;
  int ret;
  Option *in_stack_00000350;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000358;
  int in_stack_00000364;
  Net *in_stack_00000368;
  Option *in_stack_00000888;
  int in_stack_00000894;
  Mat *in_stack_00000898;
  Mat *in_stack_000008a0;
  Mat *in_stack_ffffffffffffff70;
  Mat *this_00;
  undefined4 in_stack_ffffffffffffff78;
  Mat local_68;
  int local_28;
  int local_24;
  int local_14;
  
  if ((-1 < in_ESI) &&
     (local_14 = in_ESI,
     sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 1)),
     in_ESI < (int)sVar1)) {
    local_24 = 0;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 1),(long)local_14
                       );
    if (pvVar2->dims == 0) {
      pvVar3 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                         ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(*in_RDI + 0x28),
                          (long)local_14);
      local_28 = pvVar3->producer;
      local_24 = Net::forward_layer(in_stack_00000368,in_stack_00000364,in_stack_00000358,
                                    in_stack_00000350);
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 1),(long)local_14);
    Mat::operator=((Mat *)CONCAT44(in_ESI,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70);
    if ((*(byte *)((long)in_RDI + 0x41) & 1) != 0) {
      this_00 = &local_68;
      Mat::Mat(this_00);
      convert_packing(in_stack_000008a0,in_stack_00000898,in_stack_00000894,in_stack_00000888);
      Mat::operator=((Mat *)CONCAT44(in_ESI,in_stack_ffffffffffffff78),this_00);
      Mat::~Mat((Mat *)0x144d21);
    }
    return local_24;
  }
  return -1;
}

Assistant:

int Extractor::extract(int blob_index, Mat& feat)
{
    if (blob_index < 0 || blob_index >= (int)blob_mats.size())
        return -1;

    int ret = 0;

    if (blob_mats[blob_index].dims == 0)
    {
        int layer_index = net->blobs[blob_index].producer;

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
        {
            // use local allocator
            if (!opt.blob_vkallocator)
            {
                local_blob_vkallocator = net->vkdev->acquire_blob_allocator();
                opt.blob_vkallocator = local_blob_vkallocator;
            }
            if (!opt.workspace_vkallocator)
            {
                opt.workspace_vkallocator = opt.blob_vkallocator;
            }
            if (!opt.staging_vkallocator)
            {
                local_staging_vkallocator = net->vkdev->acquire_staging_allocator();
                opt.staging_vkallocator = local_staging_vkallocator;
            }

            ncnn::VkCompute cmd(net->vkdev);
#if NCNN_BENCHMARK
            cmd.create_query_pool(net->layers.size() * 2);
#endif // NCNN_BENCHMARK

            VkMat feat_gpu;
            ret = extract(blob_index, feat_gpu, cmd);

            if (blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
            {
                // unpacking
                VkMat feat_gpu_unpacked_fp16;
                net->packing_pack1->forward(feat_gpu, feat_gpu_unpacked_fp16, cmd, opt);

                // cast to fp32 (integrated gpu)
                VkMat feat_gpu_unpacked;
                if (opt.use_fp16_storage && net->vkdev->info.type != 0)
                {
                    net->cast_float16_to_float32->forward(feat_gpu_unpacked_fp16, feat_gpu_unpacked, cmd, opt);
                }
                else
                {
                    feat_gpu_unpacked = feat_gpu_unpacked_fp16;
                }

                // download
                Mat feat_cpu_fp16;
                cmd.record_download(feat_gpu_unpacked, feat_cpu_fp16, opt);

                cmd.submit_and_wait();

#if NCNN_BENCHMARK
                std::vector<uint64_t> results(net->layers.size() * 2);
                cmd.get_query_pool_results(0, net->layers.size() * 2, results);
                for (size_t i=0; i<net->layers.size(); i++)
                {
                    uint64_t start = results[i*2];
                    uint64_t end = results[i*2+1];
                    if (start == 0 || end == 0)
                        continue;

                    double duration_us = (end - start) * net->vkdev->info.timestamp_period / 1000;
                    fprintf(stderr, "%-24s %-30s %8.2lfus    |\n", net->layers[i]->type.c_str(), net->layers[i]->name.c_str(), duration_us);
                }
#endif // NCNN_BENCHMARK

                // cast to fp32 (discrete gpu)
                Mat& feat_cpu = blob_mats[blob_index];
                if (opt.use_fp16_storage && net->vkdev->info.type == 0)
                {
                    ncnn::cast_float16_to_float32(feat_cpu_fp16, feat_cpu, opt);
                }
                else if (feat_cpu_fp16.elempack == 4 && opt.use_fp16_packed && !opt.use_fp16_storage && net->vkdev->info.type == 0)
                {
                    ncnn::cast_float16_to_float32(feat_cpu_fp16, feat_cpu, opt);
                }
                else
                {
                    feat_cpu = feat_cpu_fp16;
                }
            }
        }
        else
        {
            ret = net->forward_layer(layer_index, blob_mats, opt);
        }
#else
        ret = net->forward_layer(layer_index, blob_mats, opt);
#endif // NCNN_VULKAN

    }

    feat = blob_mats[blob_index];

    if (opt.use_packing_layout)
    {
        Mat bottom_blob_unpacked;
        convert_packing(feat, bottom_blob_unpacked, 1, opt);
        feat = bottom_blob_unpacked;
    }

    return ret;
}